

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAllPropertiesToUndefined
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          bool invalidateFixedFields)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  PropertyRecord *pPVar2;
  JavascriptLibrary *pJVar3;
  JavascriptFunction *pJVar4;
  JavascriptFunction *value;
  ushort uVar5;
  unsigned_short uVar6;
  PropertyRecord **ppPVar7;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar8;
  int iVar9;
  undefined7 in_register_00000011;
  JavascriptFunction *value_00;
  int propertyIndex;
  int index;
  int propertyIndex_1;
  int index_00;
  
  DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,'\x01');
  pBVar1 = (this->propertyMap).ptr;
  iVar9 = pBVar1->count - pBVar1->freeCount;
  index_00 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if ((int)CONCAT71(in_register_00000011,invalidateFixedFields) != 0) {
    for (index = 0; iVar9 != index; index = index + 1) {
      ppPVar7 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,index);
      pPVar2 = *ppPVar7;
      pDVar8 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetReferenceAt((this->propertyMap).ptr,index);
      InvalidateFixedField<int>(this,instance,pPVar2->pid,pDVar8);
    }
  }
  pJVar3 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pJVar4 = (JavascriptFunction *)(pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
  value = (pJVar3->super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
  for (; iVar9 != index_00; index_00 = index_00 + 1) {
    pDVar8 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetReferenceAt((this->propertyMap).ptr,index_00);
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar8);
    value_00 = pJVar4;
    if (uVar5 == 0xffff) {
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(pDVar8);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,value);
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar8);
      value_00 = value;
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar5,value_00);
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // The Var for window is reused across navigation. we shouldn't preserve the IsExtensibleFlag when we don't keep
        // the expandos. Reset the IsExtensibleFlag in cleanup scenario should be good enough
        // to cover all the preventExtension/Freeze/Seal scenarios.
        // Note that we don't change the flag for keepProperties scenario: the flags should be preserved and that's consistent
        // with other browsers.
        ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, IsExtensibleFlag);

        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = this->propertyMap->Count();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const PropertyRecord* propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                DictionaryPropertyDescriptor<T>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(instance, propertyRecord->GetPropertyId(), descriptor);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        Js::JavascriptFunction* defaultAccessor = instance->GetLibrary()->GetDefaultAccessorFunction();
        for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
        {
            DictionaryPropertyDescriptor<T>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);

            T dataPropertyIndex = descriptor->template GetDataPropertyIndex<false>();
            if (dataPropertyIndex != NoSlots)
            {
                SetSlotUnchecked(instance, dataPropertyIndex, undefined);
            }
            else
            {
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), defaultAccessor);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), defaultAccessor);
            }
        }
    }